

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::tree_node<int,_true>_> __thiscall
immutable::rrb_details::rrb_drop_right_rec<int,true,5>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<int,_true>_> *root,uint32_t right,uint32_t shift,
          bool has_left)

{
  atomic<unsigned_int> *paVar1;
  undefined4 *__s;
  internal_node<int,_true> *p_node;
  rrb_size_table<true> *__ptr;
  byte bVar2;
  uint32_t *puVar3;
  internal_node<int,_true> *piVar4;
  rrb_size_table<true> *prVar5;
  undefined4 *__ptr_00;
  int *piVar6;
  uint32_t right_00;
  char *__function;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  tree_node<int,_true> *ptVar13;
  ref<immutable::rrb_details::tree_node<int,_true>_> right_hand_node;
  ref<immutable::rrb_details::tree_node<int,_true>_> internal_root_child;
  ref<immutable::rrb_details::tree_node<int,_true>_> local_70;
  tree_node<int,_true> *local_68;
  ref<immutable::rrb_details::tree_node<int,_true>_> local_60;
  internal_node<int,_true> *local_58;
  uint32_t *local_50;
  ulong local_48;
  size_t local_40;
  rrb_size_table<true> *local_38;
  
  local_48 = (ulong)shift;
  bVar2 = (byte)shift & 0x1f;
  uVar11 = right >> bVar2;
  p_node = (internal_node<int,_true> *)root->ptr;
  local_68 = (tree_node<int,_true> *)this;
  if (shift == 0) {
    if (p_node != (internal_node<int,_true> *)0x0) {
      LOCK();
      (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    uVar10 = (ulong)(uVar11 + 1);
    __ptr_00 = (undefined4 *)malloc(uVar10 * 4 + 0x18);
    __s = __ptr_00 + 6;
    __ptr_00[1] = uVar11 + 1;
    *__ptr_00 = 0;
    *(undefined4 **)(__ptr_00 + 4) = __s;
    __ptr_00[3] = 0;
    if (uVar11 + 1 == 0) {
      LOCK();
      __ptr_00[2] = 1;
      UNLOCK();
    }
    else {
      memset(__s,0,uVar10 * 4);
      LOCK();
      __ptr_00[2] = 1;
      UNLOCK();
      if (p_node == (internal_node<int,_true> *)0x0) {
        __function = 
        "T *immutable::ref<immutable::rrb_details::leaf_node<int, true>>::operator->() const [T = immutable::rrb_details::leaf_node<int, true>]"
        ;
        goto LAB_0011a105;
      }
      prVar5 = (p_node->size_table).ptr;
      uVar7 = 0;
      do {
        __s[uVar7] = *(undefined4 *)((long)&prVar5->size + uVar7 * 4);
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
    ptVar13 = local_68;
    piVar6 = __ptr_00 + 2;
    *total_shift = 0;
    *(undefined4 **)local_68 = __ptr_00;
    LOCK();
    __ptr_00[2] = __ptr_00[2] + 1;
    UNLOCK();
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      free(__ptr_00);
    }
    if (p_node == (internal_node<int,_true> *)0x0) {
      return (ref<immutable::rrb_details::tree_node<int,_true>_>)ptVar13;
    }
    LOCK();
    paVar1 = &p_node->_ref_count;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((paVar1->super___atomic_base<unsigned_int>)._M_i != 0) {
      return (ref<immutable::rrb_details::tree_node<int,_true>_>)ptVar13;
    }
    free(p_node);
    return (ref<immutable::rrb_details::tree_node<int,_true>_>)ptVar13;
  }
  if (p_node == (internal_node<int,_true> *)0x0) {
    __function = 
    "T *immutable::ref<immutable::rrb_details::internal_node<int, true>>::operator->() const [T = immutable::rrb_details::internal_node<int, true>]"
    ;
LAB_0011a105:
    __assert_fail("ptr != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x71a,__function);
  }
  LOCK();
  (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i =
       (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  prVar5 = (p_node->size_table).ptr;
  if (prVar5 == (rrb_size_table<true> *)0x0) {
    uVar10 = (ulong)uVar11;
    local_60.ptr = (tree_node<int,_true> *)p_node->child[uVar10].ptr;
    if ((internal_node<int,_true> *)local_60.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      (((internal_node<int,_true> *)local_60.ptr)->_ref_count).super___atomic_base<unsigned_int>.
      _M_i = (((internal_node<int,_true> *)local_60.ptr)->_ref_count).
             super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    rrb_drop_right_rec<int,true,5>
              ((rrb_details *)&local_70,total_shift,&local_60,
               right - (uVar11 << ((byte)shift & 0x1f)),shift - 5,right >> bVar2 != 0 || has_left);
    if (right >> bVar2 != 0) {
      uVar11 = uVar11 + 1;
      local_50 = (uint32_t *)((ulong)uVar11 * 8);
      piVar4 = (internal_node<int,_true> *)malloc((ulong)uVar11 * 8 + 0x20);
      piVar4->len = uVar11;
      piVar4->type = INTERNAL_NODE;
      (piVar4->size_table).ptr = (rrb_size_table<true> *)0x0;
      piVar4->guid = 0;
      piVar4->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(piVar4 + 1);
      lVar9 = 0;
      memset(piVar4 + 1,0,(size_t)local_50);
      LOCK();
      (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      do {
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   ((long)&piVar4->child->ptr + lVar9),
                   (ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   ((long)&p_node->child->ptr + lVar9));
        lVar9 = lVar9 + 8;
      } while (uVar10 * 8 != lVar9);
      ref<immutable::rrb_details::internal_node<int,true>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,true>> *)(piVar4->child + uVar10),
                 &local_70);
      ptVar13 = local_68;
      *total_shift = (uint32_t)local_48;
      *(internal_node<int,_true> **)local_68 = piVar4;
      LOCK();
      (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      release<int>(piVar4);
      goto LAB_0011a0ab;
    }
    if (has_left) {
      piVar4 = (internal_node<int,_true> *)malloc(0x28);
      piVar4->type = INTERNAL_NODE;
      piVar4->len = 1;
      (piVar4->size_table).ptr = (rrb_size_table<true> *)0x0;
      piVar4->guid = 0;
      piVar4->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(piVar4 + 1);
      piVar4[1].type = LEAF_NODE;
      piVar4[1].len = 0;
      LOCK();
      (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      ref<immutable::rrb_details::internal_node<int,true>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,true>> *)(piVar4 + 1),&local_70);
      ptVar13 = local_68;
      *total_shift = (uint32_t)local_48;
      *(internal_node<int,_true> **)local_68 = piVar4;
      LOCK();
      (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      release<int>(piVar4);
      goto LAB_0011a0ab;
    }
  }
  else {
    uVar10 = (ulong)(uVar11 - 1);
    do {
      uVar7 = uVar10;
      iVar12 = (int)uVar7;
      uVar11 = iVar12 + 1;
      uVar10 = (ulong)uVar11;
    } while (prVar5->size[uVar10] <= right);
    right_00 = right;
    if (uVar11 != 0) {
      right_00 = right - prVar5->size[uVar7];
    }
    local_60.ptr = (tree_node<int,_true> *)p_node->child[uVar10].ptr;
    if ((internal_node<int,_true> *)local_60.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      (((internal_node<int,_true> *)local_60.ptr)->_ref_count).super___atomic_base<unsigned_int>.
      _M_i = (((internal_node<int,_true> *)local_60.ptr)->_ref_count).
             super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    rrb_drop_right_rec<int,true,5>
              ((rrb_details *)&local_70,total_shift,&local_60,right_00,shift - 5,
               uVar11 != 0 || has_left);
    if (uVar11 != 0) {
      uVar8 = iVar12 + 2;
      uVar7 = (ulong)uVar8;
      local_40 = uVar7 * 8;
      local_50 = total_shift;
      local_38 = prVar5;
      piVar4 = (internal_node<int,_true> *)malloc(uVar7 * 8 + 0x20);
      piVar4->len = uVar8;
      piVar4->type = INTERNAL_NODE;
      local_58 = (internal_node<int,_true> *)CONCAT44(local_58._4_4_,1);
      (piVar4->size_table).ptr = (rrb_size_table<true> *)0x0;
      lVar9 = 0;
      piVar4->guid = 0;
      piVar4->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(piVar4 + 1);
      memset(piVar4 + 1,0,local_40);
      LOCK();
      (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      prVar5 = (rrb_size_table<true> *)malloc(uVar7 * 4 + 0x10);
      prVar5->size = (uint32_t *)(prVar5 + 1);
      prVar5->guid = 0;
      LOCK();
      (prVar5->_ref_count).super___atomic_base<unsigned_int>._M_i = (__int_type)local_58;
      UNLOCK();
      local_58 = (internal_node<int,_true> *)&prVar5->_ref_count;
      memcpy(prVar5 + 1,local_38->size,uVar10 * 4);
      *(uint32_t *)((long)&prVar5[1].size + uVar10 * 4) = right + 1;
      do {
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   ((long)&piVar4->child->ptr + lVar9),
                   (ref<immutable::rrb_details::internal_node<int,_true>_> *)
                   ((long)&p_node->child->ptr + lVar9));
        puVar3 = local_50;
        lVar9 = lVar9 + 8;
      } while ((ulong)uVar11 << 3 != lVar9);
      LOCK();
      (prVar5->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (prVar5->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      __ptr = (piVar4->size_table).ptr;
      (piVar4->size_table).ptr = prVar5;
      if (__ptr != (rrb_size_table<true> *)0x0) {
        LOCK();
        paVar1 = &__ptr->_ref_count;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(__ptr);
        }
      }
      ref<immutable::rrb_details::internal_node<int,true>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,true>> *)(piVar4->child + uVar10),
                 &local_70);
      ptVar13 = local_68;
      *puVar3 = (uint32_t)local_48;
      *(internal_node<int,_true> **)local_68 = piVar4;
      LOCK();
      (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      LOCK();
      ((__atomic_base<unsigned_int> *)&local_58->type)->_M_i =
           ((__atomic_base<unsigned_int> *)&local_58->type)->_M_i - 1;
      UNLOCK();
      if (((__atomic_base<unsigned_int> *)&local_58->type)->_M_i == 0) {
        free(prVar5);
      }
      release<int>(piVar4);
      goto LAB_0011a0ab;
    }
    if (has_left) {
      local_50 = total_shift;
      piVar4 = (internal_node<int,_true> *)malloc(0x28);
      piVar4->type = INTERNAL_NODE;
      piVar4->len = 1;
      (piVar4->size_table).ptr = (rrb_size_table<true> *)0x0;
      piVar4->guid = 0;
      local_58 = piVar4 + 1;
      piVar4->child = (ref<immutable::rrb_details::internal_node<int,_true>_> *)local_58;
      piVar4[1].type = LEAF_NODE;
      piVar4[1].len = 0;
      LOCK();
      (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      prVar5 = (rrb_size_table<true> *)malloc(0x14);
      prVar5->size = (uint32_t *)(prVar5 + 1);
      prVar5->guid = 0;
      LOCK();
      (prVar5->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      paVar1 = &prVar5->_ref_count;
      *(uint32_t *)&prVar5[1].size = right + 1;
      LOCK();
      (prVar5->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (prVar5->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      (piVar4->size_table).ptr = prVar5;
      ref<immutable::rrb_details::internal_node<int,true>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,true>> *)local_58,&local_70);
      ptVar13 = local_68;
      *local_50 = (uint32_t)local_48;
      *(internal_node<int,_true> **)local_68 = piVar4;
      LOCK();
      (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (piVar4->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      LOCK();
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
        free(prVar5);
      }
      release<int>(piVar4);
      goto LAB_0011a0ab;
    }
  }
  *(tree_node<int,_true> **)local_68 = local_70.ptr;
  ptVar13 = local_68;
  if (local_70.ptr != (tree_node<int,_true> *)0x0) {
    LOCK();
    ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((local_70.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
LAB_0011a0ab:
  ref<immutable::rrb_details::tree_node<int,_true>_>::~ref(&local_70);
  ref<immutable::rrb_details::tree_node<int,_true>_>::~ref(&local_60);
  release<int>(p_node);
  return (ref<immutable::rrb_details::tree_node<int,_true>_>)ptVar13;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_right_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t right, uint32_t shift, bool has_left)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = right >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        if (internal_root->size_table.ptr == nullptr)
          {
          ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, child, right - (subidx << shift), subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              right_hand_parent->child[0] = right_hand_node;
              *total_shift = shift;
              return right_hand_parent;
              }
            else { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->child[subidx] = right_hand_node;
            *total_shift = shift;
            return sliced_root;
            }
          }
        else
          { // if (internal_root->size_table != NULL)
          rrb_size_table<atomic_ref_counting>* table = internal_root->size_table.ptr;
          uint32_t idx = right;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }

          ref<tree_node<T, atomic_ref_counting>> internal_root_child = internal_root->child[subidx];
          ref<tree_node<T, atomic_ref_counting>> right_hand_node = rrb_drop_right_rec<T, atomic_ref_counting, N>(total_shift, internal_root_child, idx, subshift, (subidx != 0) | has_left);
          if (subidx == 0)
            {
            if (has_left)
              {
              // As there is one above us, must place the right hand node in a
              // one-node
              ref<internal_node<T, atomic_ref_counting>> right_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
              ref<rrb_size_table<atomic_ref_counting>> right_hand_table = size_table_create<atomic_ref_counting>(1);

              right_hand_table->size[0] = right + 1;
              // TODO: Not set size_table if the underlying node doesn't have a
              // table as well.
              right_hand_parent->size_table = right_hand_table;
              right_hand_parent->child[0] = right_hand_node;

              *total_shift = shift;
              return right_hand_parent;
              }
            else
              { // if (!has_left)
              return right_hand_node;
              }
            }
          else
            { // if (subidx != 0)
            ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(subidx + 1);
            ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(subidx + 1);

            memcpy(sliced_table->size, table->size, subidx * sizeof(uint32_t));
            sliced_table->size[subidx] = right + 1;

            for (uint32_t i = 0; i < subidx; ++i)
              sliced_root->child[i] = internal_root->child[i];
            sliced_root->size_table = sliced_table;
            sliced_root->child[subidx] = right_hand_node;

            *total_shift = shift;
            return sliced_root;
            }
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        // Just pure copying into a new node
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        ref<leaf_node<T, atomic_ref_counting>> left_vals = leaf_node_create<T, atomic_ref_counting>(subidx + 1);

        //memcpy(left_vals->child, leaf_root->child, (subidx + 1) * sizeof(T));
        for (uint32_t i = 0; i < subidx + 1; ++i)
          left_vals->child[i] = leaf_root->child[i]; // don't memcpy, but use copy constructor

        *total_shift = shift;
        return left_vals;
        }
      }